

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnDataSegmentData
          (BinaryReaderObjdump *this,Index index,void *src_data,Address size)

{
  Offset OVar1;
  Offset OVar2;
  ObjdumpState *pOVar3;
  pointer pRVar4;
  uint uVar5;
  ulong uVar6;
  string_view sVar7;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    PrintDetails(this," - segment[%u]",index);
    sVar7 = BinaryReaderObjdumpBase::GetSegmentName(&this->super_BinaryReaderObjdumpBase,index);
    if (sVar7.size_ != 0) {
      PrintDetails(this," <%.*s>",sVar7.size_,sVar7.data_);
    }
    if ((this->data_flags_ & 1) == 0) {
      PrintDetails(this," memory=%u",(ulong)this->data_mem_index_);
    }
    else {
      PrintDetails(this," passive");
    }
    PrintDetails(this," size=%lu",size);
    if ((this->data_flags_ & 1) == 0) {
      PrintInitExpr(this,&this->data_init_expr_);
    }
    else {
      PrintDetails(this,"\n");
    }
    Stream::WriteMemoryDump
              (&((this->out_stream_)._M_t.
                 super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
                 super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
               src_data,size,(ulong)this->data_offset_,Yes,"  - ",(char *)0x0);
    if (((this->super_BinaryReaderObjdumpBase).options_)->relocs == true) {
      OVar1 = (this->super_BinaryReaderObjdumpBase).section_starts_[0xb];
      OVar2 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset;
      uVar5 = this->next_data_reloc_;
      while( true ) {
        uVar6 = (ulong)uVar5;
        pOVar3 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
        pRVar4 = (pOVar3->data_relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(pOVar3->data_relocations).
                           super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pRVar4) / 0x18) <= uVar6)
        break;
        if (((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset < pRVar4[uVar6].offset + OVar1) {
          return (Result)Ok;
        }
        BinaryReaderObjdumpBase::PrintRelocation
                  (&this->super_BinaryReaderObjdumpBase,pRVar4 + uVar6,
                   (ulong)this->data_offset_ + pRVar4[uVar6].offset + ((size + OVar1) - OVar2));
        uVar5 = this->next_data_reloc_ + 1;
        this->next_data_reloc_ = uVar5;
      }
    }
  }
  return (Result)Ok;
}

Assistant:

bool BinaryReaderObjdump::ShouldPrintDetails() {
  if (options_->mode != ObjdumpMode::Details) {
    return false;
  }
  return print_details_;
}